

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# function.c
# Opt level: O2

sysbvm_tuple_t
sysbvm_ordinaryFunction_memoizedApply
          (sysbvm_context_t *context,sysbvm_tuple_t function_,size_t argumentCount,
          sysbvm_tuple_t *arguments,sysbvm_bitflags_t applicationFlags)

{
  _Bool _Var1;
  size_t i;
  size_t sVar2;
  sysbvm_tuple_t sVar3;
  sysbvm_bitflags_t sVar4;
  sysbvm_context_t *function;
  sysbvm_context_t *local_108;
  sysbvm_tuple_t local_100;
  sysbvm_tuple_t sStack_f8;
  sysbvm_tuple_t local_f0;
  sysbvm_stackFrameGCRootsRecord_t argumentsRecord;
  sysbvm_stackFrameRecord_t local_c8;
  undefined8 local_b8;
  undefined1 *local_b0;
  sysbvm_tuple_t templateArguments [16];
  
  local_b0 = (undefined1 *)&local_108;
  local_100 = 0;
  sStack_f8 = 0;
  local_f0 = 0;
  local_c8.previous = (sysbvm_stackFrameRecord_s *)0x0;
  local_c8.type = SYSBVM_STACK_FRAME_RECORD_TYPE_GC_ROOTS;
  local_c8._12_4_ = 0;
  local_b8 = 4;
  local_108 = (sysbvm_context_t *)function_;
  sysbvm_stackFrame_pushRecord(&local_c8);
  argumentsRecord.previous = (sysbvm_stackFrameRecord_t *)0x0;
  argumentsRecord.type = SYSBVM_STACK_FRAME_RECORD_TYPE_GC_ROOTS;
  argumentsRecord.rootCount = argumentCount;
  argumentsRecord.roots = arguments;
  sysbvm_stackFrame_pushRecord((sysbvm_stackFrameRecord_t *)&argumentsRecord);
  if (argumentCount < 2) {
    if (argumentCount == 1) {
      local_100 = *arguments;
    }
  }
  else {
    local_100 = sysbvm_array_create(context,argumentCount);
    for (sVar2 = 0; argumentCount != sVar2; sVar2 = sVar2 + 1) {
      if ((local_100 & 0xf) == 0 && local_100 != 0) {
        *(sysbvm_tuple_t *)(local_100 + 0x10 + sVar2 * 8) = arguments[sVar2];
      }
    }
  }
  sVar3 = *(sysbvm_tuple_t *)&(local_108->heap).gcRootTableAllocator.requiresExecutableMapping;
  if (sVar3 == 0) {
    sVar3 = sysbvm_weakValueDictionary_create(context);
    *(sysbvm_tuple_t *)&(local_108->heap).gcRootTableAllocator.requiresExecutableMapping = sVar3;
  }
  _Var1 = sysbvm_weakValueDictionary_find(context,sVar3,local_100,&local_f0);
  if (_Var1) {
    if (local_f0 == 0x5f) {
      sysbvm_error("Computing cyclic memoized value.");
    }
    sysbvm_stackFrame_popRecord((sysbvm_stackFrameRecord_t *)&argumentsRecord);
  }
  else {
    sysbvm_weakValueDictionary_atPut
              (context,*(sysbvm_tuple_t *)
                        &(local_108->heap).gcRootTableAllocator.requiresExecutableMapping,local_100,
               0x5f);
    sVar3 = *(sysbvm_tuple_t *)&(local_108->heap).gcRootTableAllocator.requiresExecutableMapping;
    sysbvm_weakValueDictionary_findAssociation(context,sVar3,local_100,&sStack_f8);
    sysbvm_stackFrame_popRecord((sysbvm_stackFrameRecord_t *)&argumentsRecord);
    function = local_108;
    sVar4 = sysbvm_function_getFlags(local_108,sVar3);
    if (((uint)sVar4 >> 10 & 1) != 0) {
      if (0x10 < argumentCount + 1) {
        sysbvm_error_assertionFailure
                  (
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/ronsaldo[P]sysmel/lib/sysbvm/function.c:305: assertion failure: argumentCount + 1 <= SYSBVM_MAX_FUNCTION_ARGUMENTS"
                  );
      }
      templateArguments[0] = sStack_f8;
      for (sVar2 = 0; argumentCount != sVar2; sVar2 = sVar2 + 1) {
        templateArguments[sVar2 + 1] = arguments[sVar2];
      }
      arguments = templateArguments;
      argumentCount = argumentCount + 1;
      function = local_108;
    }
    local_f0 = sysbvm_ordinaryFunction_directApply
                         (context,(sysbvm_tuple_t)function,argumentCount,arguments,applicationFlags)
    ;
    if (((sStack_f8 & 0xf) == 0 && sStack_f8 != 0) && (0xf < *(uint *)(sStack_f8 + 0xc))) {
      *(sysbvm_tuple_t *)(sStack_f8 + 0x18) = local_f0;
    }
  }
  sysbvm_stackFrame_popRecord(&local_c8);
  return local_f0;
}

Assistant:

SYSBVM_API sysbvm_tuple_t sysbvm_ordinaryFunction_memoizedApply(sysbvm_context_t *context, sysbvm_tuple_t function_, size_t argumentCount, sysbvm_tuple_t *arguments, sysbvm_bitflags_t applicationFlags)
{
    struct {
        sysbvm_tuple_t function;
        sysbvm_tuple_t memoizationKey;
        sysbvm_tuple_t memoizationAssociation;
        sysbvm_tuple_t result;
    } gcFrame = {
        .function = function_
    };
    SYSBVM_STACKFRAME_PUSH_GC_ROOTS(gcFrameRecord, gcFrame);

    sysbvm_stackFrameGCRootsRecord_t argumentsRecord = {
        .type = SYSBVM_STACK_FRAME_RECORD_TYPE_GC_ROOTS,
        .rootCount = argumentCount,
        .roots = arguments
    };
    sysbvm_stackFrame_pushRecord((sysbvm_stackFrameRecord_t*)&argumentsRecord);

    sysbvm_function_t **functionObject = (sysbvm_function_t**)&gcFrame.function;

    // Make the memoization lookup key.
    if(argumentCount > 1)
    {
        gcFrame.memoizationKey = sysbvm_array_create(context, argumentCount);
        for(size_t i = 0; i < argumentCount; ++i)
            sysbvm_array_atPut(gcFrame.memoizationKey, i , arguments[i]);
    }
    else if(argumentCount == 1)
    {
        gcFrame.memoizationKey = arguments[0];
    }

    // Find the result in the memoization table
    if(!(*functionObject)->memoizationTable)
        (*functionObject)->memoizationTable = sysbvm_weakValueDictionary_create(context);

    if(sysbvm_weakValueDictionary_find(context, (*functionObject)->memoizationTable, gcFrame.memoizationKey, &gcFrame.result))
    {
        if(gcFrame.result == SYSBVM_PENDING_MEMOIZATION_VALUE)
            sysbvm_error("Computing cyclic memoized value.");

        sysbvm_stackFrame_popRecord((sysbvm_stackFrameRecord_t*)&argumentsRecord);
        SYSBVM_STACKFRAME_POP_GC_ROOTS(gcFrameRecord);
        return gcFrame.result;
    }
    else
    {
        sysbvm_weakValueDictionary_atPut(context, (*functionObject)->memoizationTable, gcFrame.memoizationKey, SYSBVM_PENDING_MEMOIZATION_VALUE);
        sysbvm_weakValueDictionary_findAssociation(context, (*functionObject)->memoizationTable, gcFrame.memoizationKey, &gcFrame.memoizationAssociation);
    }

    // Apply the actual function.
    sysbvm_stackFrame_popRecord((sysbvm_stackFrameRecord_t*)&argumentsRecord);

    if(sysbvm_function_isTemplate(context, gcFrame.function))
    {
        SYSBVM_ASSERT(argumentCount + 1 <= SYSBVM_MAX_FUNCTION_ARGUMENTS);
        sysbvm_tuple_t templateArguments[SYSBVM_MAX_FUNCTION_ARGUMENTS];
        templateArguments[0] = gcFrame.memoizationAssociation;
        for(size_t i = 0; i < argumentCount; ++i)
            templateArguments[i + 1] = arguments[i];

        gcFrame.result = sysbvm_ordinaryFunction_directApply(context, gcFrame.function, argumentCount + 1, templateArguments, applicationFlags);
    }
    else
    {
        gcFrame.result = sysbvm_ordinaryFunction_directApply(context, gcFrame.function, argumentCount, arguments, applicationFlags);
    }

    // Store the result
    sysbvm_association_setValue(gcFrame.memoizationAssociation, gcFrame.result);
    SYSBVM_STACKFRAME_POP_GC_ROOTS(gcFrameRecord);
    return gcFrame.result;
}